

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall Parser::parse_expression_list(Parser *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_71;
  string local_70;
  allocator<char> local_39;
  string local_38;
  int local_14;
  Parser *pPStack_10;
  int arg_count;
  Parser *this_local;
  
  pPStack_10 = this;
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<expression_list>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  local_14 = 0;
  parse_expression(this);
  while( true ) {
    local_14 = local_14 + 1;
    bVar1 = std::operator==(&this->cur_token,",");
    if (!bVar1) break;
    poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>,</symbol>");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    query_tokenizer(this);
    parse_expression(this);
  }
  Symbol_Table::set_temp_arg_count(&this->symbol_table,local_14);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,")",&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"identifier",&local_71);
  check_expected_x_after_y(this,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t\t<symbol>)</symbol>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)this->out_file,"\t\t\t\t</expression_list>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  query_tokenizer(this);
  return;
}

Assistant:

void Parser::parse_expression_list() {
    out_file << "\t\t\t\t\t<expression_list>" << std::endl;
    // for recording arg counts of
    int arg_count = 0;
    parse_expression();
    arg_count++;

    while (cur_token == ",") {
        out_file << "\t\t\t\t\t<symbol>,</symbol>" << std::endl;
        query_tokenizer();

        parse_expression();
        arg_count++;
    }
    symbol_table.set_temp_arg_count(arg_count);
    check_expected_x_after_y(")", "identifier");
    out_file << "\t\t\t\t\t<symbol>)</symbol>" << std::endl;
    out_file << "\t\t\t\t</expression_list>" << std::endl;
    query_tokenizer();
}